

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

HRESULT Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::
        GenerateValidPointersMapForBlockType(PAL_FILE *file)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ValidPointersMapRow *validTable;
  SmallHeapBlockBitVector *invalidTable;
  BlockInfoMapTable *blockInfoTable;
  ValidPointersMapRow *pauVar5;
  ulong uVar6;
  char16_t *pcVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  SmallHeapBlockBitVector *pSVar11;
  
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0xcc,"(file != nullptr)","file != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  validTable = (ValidPointersMapRow *)malloc(0xc000);
  invalidTable = (SmallHeapBlockBitVector *)malloc(0x600);
  blockInfoTable = (BlockInfoMapTable *)malloc(0xc0);
  uVar10 = 0x80004005;
  if (blockInfoTable != (BlockInfoMapTable *)0x0 &&
      (invalidTable != (SmallHeapBlockBitVector *)0x0 &&
      (ValidPointersMapTable *)validTable != (ValidPointersMapTable *)0x0)) {
    GenerateValidPointersMap
              ((ValidPointersMapTable *)validTable,(InvalidBitsTable *)invalidTable,blockInfoTable);
    iVar3 = PAL_fwprintf(file,L"#if USE_VPM_TABLE\n");
    if ((-1 < iVar3) &&
       (iVar3 = PAL_fwprintf(file,
                             L"const ushort HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::validPointersBuffer[HeapConstants::BucketCount][HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::rowSize] = \n{\n"
                            ), -1 < iVar3)) {
      lVar9 = 0;
      pauVar5 = validTable;
      do {
        iVar3 = PAL_fwprintf(file,L"    {\n        ");
        if (iVar3 < 0) goto LAB_006df44b;
        lVar8 = -0x200;
        do {
          pcVar7 = L"0x%04hX, ";
          if (lVar8 == -1) {
            pcVar7 = L"0x%04hX";
          }
          iVar3 = PAL_fwprintf(file,pcVar7,(ulong)pauVar5[1][lVar8]);
          if (iVar3 < 0) goto LAB_006df44b;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
        pcVar7 = L"\n    },\n";
        if (lVar9 == 0x2f) {
          pcVar7 = L"\n    }\n";
        }
        iVar3 = PAL_fwprintf(file,pcVar7);
        if (iVar3 < 0) goto LAB_006df44b;
        lVar9 = lVar9 + 1;
        pauVar5 = pauVar5 + 1;
      } while (lVar9 != 0x30);
      iVar3 = PAL_fwprintf(file,L"};\n");
      uVar10 = 0x80004005;
      if (((-1 < iVar3) && (iVar3 = PAL_fwprintf(file,L"#endif // USE_VPM_TABLE\n\n"), -1 < iVar3))
         && (iVar3 = PAL_fwprintf(file,
                                  L"const BVUnit HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData[HeapConstants::BucketCount][SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n"
                                 ), -1 < iVar3)) {
        lVar9 = 0;
        pSVar11 = invalidTable;
        do {
          iVar3 = PAL_fwprintf(file,L"    {\n        ");
          if (iVar3 < 0) goto LAB_006df44b;
          lVar8 = 0;
          do {
            pcVar7 = L"0x%016I64X, ";
            if (lVar8 == 3) {
              pcVar7 = L"0x%016I64X";
            }
            iVar3 = PAL_fwprintf(file,pcVar7,
                                 ((SmallHeapBlockBitVector *)pSVar11->data)->data[lVar8].word);
            if (iVar3 < 0) goto LAB_006df44b;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          pcVar7 = L"\n    },\n";
          if (lVar9 == 0x2f) {
            pcVar7 = L"\n    }\n";
          }
          iVar3 = PAL_fwprintf(file,pcVar7);
          if (iVar3 < 0) goto LAB_006df44b;
          lVar9 = lVar9 + 1;
          pSVar11 = pSVar11 + 1;
        } while (lVar9 != 0x30);
        iVar3 = PAL_fwprintf(file,
                             L"};\n// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\nconst HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsBuffers =\n    reinterpret_cast<const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData);\n"
                            );
        if ((iVar3 < 0) ||
           (iVar3 = PAL_fwprintf(file,
                                 L"const SmallHeapBlockT<SmallAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::blockInfoBuffer[SmallAllocationBlockAttributes::BucketCount][SmallAllocationBlockAttributes::PageCount] = {\n"
                                ), iVar3 < 0)) {
LAB_006df44b:
          uVar10 = 0x80004005;
        }
        else {
          uVar6 = 0x10;
          lVar9 = 0;
          do {
            iVar3 = PAL_fwprintf(file,L"    // Bucket: %u, Size: %d\n",lVar9,uVar6);
            if (((iVar3 < 0) || (iVar3 = PAL_fwprintf(file,L"    {\n"), iVar3 < 0)) ||
               ((iVar3 = PAL_fwprintf(file,L"        { "), iVar3 < 0 ||
                ((iVar3 = PAL_fwprintf(file,L"0x%04hX, 0x%04hX",
                                       (ulong)(*blockInfoTable)[lVar9][0].lastObjectIndexOnPage,
                                       (ulong)(*blockInfoTable)[lVar9][0].pageObjectCount),
                 iVar3 < 0 || (iVar3 = PAL_fwprintf(file,L" }\n"), iVar3 < 0))))))
            goto LAB_006df44b;
            pcVar7 = L"\n    },\n";
            if (lVar9 == 0x2f) {
              pcVar7 = L"\n    }\n";
            }
            iVar3 = PAL_fwprintf(file,pcVar7 + 1);
            if (iVar3 < 0) goto LAB_006df44b;
            lVar9 = lVar9 + 1;
            uVar6 = (ulong)((int)uVar6 + 0x10);
          } while (lVar9 != 0x30);
          iVar3 = PAL_fwprintf(file,L"};\n");
          uVar10 = iVar3 >> 0x1f & 0x80004005;
        }
      }
    }
  }
  free(validTable);
  free(invalidTable);
  return uVar10;
}

Assistant:

HRESULT HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(FILE* file)
{
#define IfErrorGotoCleanup(result) if ((result) < 0) { hr = E_FAIL; goto cleanup; }

    Assert(file != nullptr);
    HRESULT hr = S_OK;

    // Use heap to allocate the table so we don't bloat the stack (~64k). We only use this function
    // to generate headers as part of testing.
    ValidPointersMapTable *valid = (ValidPointersMapTable *)malloc(sizeof(ValidPointersMapTable));
    InvalidBitsTable *invalid = (InvalidBitsTable *)malloc(sizeof(InvalidBitsTable));
    BlockInfoMapTable *blockMap = (BlockInfoMapTable*)malloc(sizeof(BlockInfoMapTable));

    if (valid == nullptr || invalid == nullptr || blockMap == nullptr)
    {
        hr = E_FAIL;
        goto cleanup;
    }
    GenerateValidPointersMap(valid, *invalid, *blockMap);

    IfErrorGotoCleanup(fwprintf(file, _u("#if USE_VPM_TABLE\n")))
    IfErrorGotoCleanup(fwprintf(file, _u("const ushort HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::validPointersBuffer[HeapConstants::BucketCount][HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::rowSize] = \n{\n")));
    // Generate the full buffer.
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));
        for (unsigned j = 0; j < rowSize; ++j)
        {
            IfErrorGotoCleanup(fwprintf(
                file,
                (j < rowSize - 1) ? _u("0x%04hX, ") : _u("0x%04hX"),
                (*valid)[i][j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }
    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));
    IfErrorGotoCleanup(fwprintf(file, _u("#endif // USE_VPM_TABLE\n\n")))

    // Generate the invalid bitvectors.
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const BVUnit HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData[HeapConstants::BucketCount][SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));

        for (unsigned j = 0; j < (*invalid)[i].wordCount; ++j)
        {
            const char16 *format = (j < (*invalid)[i].wordCount - 1) ?
#if defined(TARGET_32)
                _u("0x%08X, ") : _u("0x%08X")
#elif defined(TARGET_64)
                _u("0x%016I64X, ") : _u("0x%016I64X")
#else
#error "Platform is not handled"
#endif
                ;
            IfErrorGotoCleanup(fwprintf(file, format, (*invalid)[i].GetRawData()[j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(
        file,
        _u("};\n")
        _u("// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\n")
        _u("const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsBuffers =\n")
        _u("    reinterpret_cast<const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData);\n")));

    // Generate the block map table
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const SmallHeapBlockT<SmallAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::blockInfoBuffer[SmallAllocationBlockAttributes::BucketCount][SmallAllocationBlockAttributes::PageCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    // Bucket: %u, Size: %d\n"), i, (int) (HeapConstants::ObjectGranularity + (i * SmallAllocationBlockAttributes::BucketGranularity))));
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n")));

        for (unsigned j = 0; j < SmallAllocationBlockAttributes::PageCount; ++j)
        {
            IfErrorGotoCleanup(fwprintf(file, _u("        { ")));

            const char16 *format = _u("0x%04hX, 0x%04hX");
            IfErrorGotoCleanup(fwprintf(file, format, (*blockMap)[i][j].lastObjectIndexOnPage, (*blockMap)[i][j].pageObjectCount));
#if USE_FEWER_PAGES_PER_BLOCK
            IfErrorGotoCleanup(fwprintf(file, _u(" }\n")));
#else
            IfErrorGotoCleanup(fwprintf(file, (j < SmallAllocationBlockAttributes::PageCount - 1 ? _u(" },\n") : _u(" }\n"))));
#endif
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("    },\n") : _u("    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));

cleanup:
#undef IfErrorGotoCleanup
    free(valid);
    free(invalid);
    return hr;
}